

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_result ma_pcm_rb_acquire_write(ma_pcm_rb *pRB,ma_uint32 *pSizeInFrames,void **ppBufferOut)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  void *__s;
  ma_result mVar4;
  
  if (pRB == (ma_pcm_rb *)0x0) {
    mVar4 = -2;
  }
  else {
    uVar3 = pRB->channels * *pSizeInFrames * (&DAT_001157a0)[pRB->format];
    if (ppBufferOut == (void **)0x0) {
      mVar4 = -2;
    }
    else {
      uVar2 = (pRB->rb).encodedReadOffset;
      uVar1 = (pRB->rb).encodedWriteOffset;
      if ((int)(uVar1 ^ uVar2) < 0) {
        uVar2 = uVar2 & 0x7fffffff;
      }
      else {
        uVar2 = (pRB->rb).subbufferSizeInBytes;
      }
      uVar2 = uVar2 - (uVar1 & 0x7fffffff);
      if (uVar2 <= uVar3) {
        uVar3 = uVar2;
      }
      __s = (void *)((ulong)((pRB->rb).encodedWriteOffset & 0x7fffffff) + (long)(pRB->rb).pBuffer);
      *ppBufferOut = __s;
      mVar4 = 0;
      if (((pRB->rb).field_0x1c & 2) != 0) {
        mVar4 = 0;
        memset(__s,0,(ulong)uVar3);
      }
    }
    if (ppBufferOut != (void **)0x0) {
      mVar4 = 0;
      *pSizeInFrames = uVar3 / ((&DAT_001157a0)[pRB->format] * pRB->channels);
    }
  }
  return mVar4;
}

Assistant:

MA_API ma_result ma_pcm_rb_acquire_write(ma_pcm_rb* pRB, ma_uint32* pSizeInFrames, void** ppBufferOut)
{
    size_t sizeInBytes;
    ma_result result;

    if (pRB == NULL) {
        return MA_INVALID_ARGS;
    }

    sizeInBytes = *pSizeInFrames * ma_pcm_rb_get_bpf(pRB);

    result = ma_rb_acquire_write(&pRB->rb, &sizeInBytes, ppBufferOut);
    if (result != MA_SUCCESS) {
        return result;
    }

    *pSizeInFrames = (ma_uint32)(sizeInBytes / ma_pcm_rb_get_bpf(pRB));
    return MA_SUCCESS;
}